

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

void Vec_StrPutI_(Vec_Str_t *vOut,int Val)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)Val;
  if (0x7f < Val) {
    do {
      uVar4 = vOut->nSize;
      if (uVar4 == vOut->nCap) {
        if ((int)uVar4 < 0x10) {
          if (vOut->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(0x10);
          }
          else {
            pcVar3 = (char *)realloc(vOut->pArray,0x10);
          }
          vOut->pArray = pcVar3;
          vOut->nCap = 0x10;
        }
        else {
          sVar2 = (ulong)uVar4 * 2;
          if (vOut->pArray == (char *)0x0) {
            pcVar3 = (char *)malloc(sVar2);
          }
          else {
            pcVar3 = (char *)realloc(vOut->pArray,sVar2);
          }
          vOut->pArray = pcVar3;
          vOut->nCap = (int)sVar2;
        }
      }
      else {
        pcVar3 = vOut->pArray;
      }
      uVar4 = (uint)uVar5;
      iVar1 = vOut->nSize;
      vOut->nSize = iVar1 + 1;
      pcVar3[iVar1] = (byte)uVar5 | 0x80;
      uVar5 = uVar5 >> 7;
    } while (0x3fff < uVar4);
  }
  uVar4 = vOut->nSize;
  if (uVar4 == vOut->nCap) {
    if ((int)uVar4 < 0x10) {
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(0x10);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,0x10);
      }
      vOut->pArray = pcVar3;
      vOut->nCap = 0x10;
    }
    else {
      sVar2 = (ulong)uVar4 * 2;
      if (vOut->pArray == (char *)0x0) {
        pcVar3 = (char *)malloc(sVar2);
      }
      else {
        pcVar3 = (char *)realloc(vOut->pArray,sVar2);
      }
      vOut->pArray = pcVar3;
      vOut->nCap = (int)sVar2;
    }
  }
  else {
    pcVar3 = vOut->pArray;
  }
  iVar1 = vOut->nSize;
  vOut->nSize = iVar1 + 1;
  pcVar3[iVar1] = (char)uVar5;
  return;
}

Assistant:

static inline void Vec_StrPutI_( Vec_Str_t * vOut, int Val )     { Vec_StrPutI( vOut, Val );  }